

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# swish_x86.cpp
# Opt level: O3

int __thiscall ncnn::Swish_x86::forward_inplace(Swish_x86 *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  uint uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int iVar5;
  ulong uVar6;
  float *pfVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  float fVar19;
  float fVar21;
  float fVar22;
  float fVar23;
  undefined1 auVar20 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  
  auVar4 = _DAT_00316910;
  auVar18 = _DAT_00316900;
  uVar2 = bottom_top_blob->c;
  uVar9 = bottom_top_blob->h * bottom_top_blob->w;
  if (bottom_top_blob->elempack == 4) {
    if (0 < (int)uVar2) {
      uVar6 = 0;
      do {
        if (0 < (int)uVar9) {
          pfVar7 = (float *)(bottom_top_blob->cstep * uVar6 * bottom_top_blob->elemsize +
                            (long)bottom_top_blob->data);
          uVar8 = uVar9;
          do {
            fVar1 = pfVar7[2];
            fVar12 = pfVar7[3];
            auVar24._0_8_ = *(ulong *)pfVar7 ^ 0x8000000080000000;
            auVar24._8_4_ = -fVar1;
            auVar24._12_4_ = -fVar12;
            auVar25 = minps(auVar24,auVar18);
            auVar25 = maxps(auVar25,auVar4);
            fVar19 = auVar25._0_4_ * 1.442695 + 0.5;
            fVar21 = auVar25._4_4_ * 1.442695 + 0.5;
            fVar22 = auVar25._8_4_ * 1.442695 + 0.5;
            fVar23 = auVar25._12_4_ * 1.442695 + 0.5;
            fVar11 = (float)(int)fVar19;
            fVar13 = (float)(int)fVar21;
            fVar14 = (float)(int)fVar22;
            fVar15 = (float)(int)fVar23;
            fVar11 = fVar11 - (float)(-(uint)(fVar19 < fVar11) & 0x3f800000);
            fVar13 = fVar13 - (float)(-(uint)(fVar21 < fVar13) & 0x3f800000);
            fVar14 = fVar14 - (float)(-(uint)(fVar22 < fVar14) & 0x3f800000);
            fVar15 = fVar15 - (float)(-(uint)(fVar23 < fVar15) & 0x3f800000);
            fVar19 = fVar11 * -0.6931472 + auVar25._0_4_;
            fVar21 = fVar13 * -0.6931472 + auVar25._4_4_;
            fVar22 = fVar14 * -0.6931472 + auVar25._8_4_;
            fVar23 = fVar15 * -0.6931472 + auVar25._12_4_;
            auVar20._0_4_ =
                 (((((fVar19 * 0.00019875691 + 0.0013981999) * fVar19 + 0.008333452) * fVar19 +
                   0.041665796) * fVar19 + 0.16666666) * fVar19 + 0.5) * fVar19 * fVar19;
            auVar20._4_4_ =
                 (((((fVar21 * 0.00019875691 + 0.0013981999) * fVar21 + 0.008333452) * fVar21 +
                   0.041665796) * fVar21 + 0.16666666) * fVar21 + 0.5) * fVar21 * fVar21;
            auVar20._8_4_ =
                 (((((fVar22 * 0.00019875691 + 0.0013981999) * fVar22 + 0.008333452) * fVar22 +
                   0.041665796) * fVar22 + 0.16666666) * fVar22 + 0.5) * fVar22 * fVar22;
            auVar20._12_4_ =
                 (((((fVar23 * 0.00019875691 + 0.0013981999) * fVar23 + 0.008333452) * fVar23 +
                   0.041665796) * fVar23 + 0.16666666) * fVar23 + 0.5) * fVar23 * fVar23;
            fVar11 = (float)((int)fVar11 * 0x800000 + 0x3f800000) * (fVar19 + 1.0 + auVar20._0_4_) +
                     1.0;
            fVar13 = (float)((int)fVar13 * 0x800000 + 0x3f800000) * (fVar21 + 1.0 + auVar20._4_4_) +
                     1.0;
            fVar14 = (float)((int)fVar14 * 0x800000 + 0x3f800000) * (fVar22 + 1.0 + auVar20._8_4_) +
                     1.0;
            fVar15 = (float)((int)fVar15 * 0x800000 + 0x3f800000) * (fVar23 + 1.0 + auVar20._12_4_)
                     + 1.0;
            auVar3._4_4_ = fVar13;
            auVar3._0_4_ = fVar11;
            auVar3._8_4_ = fVar14;
            auVar3._12_4_ = fVar15;
            auVar25 = rcpps(auVar20,auVar3);
            fVar19 = *pfVar7 * auVar25._0_4_;
            fVar21 = pfVar7[1] * auVar25._4_4_;
            fVar22 = fVar1 * auVar25._8_4_;
            fVar23 = fVar12 * auVar25._12_4_;
            *pfVar7 = (*pfVar7 - fVar11 * fVar19) * auVar25._0_4_ + fVar19;
            pfVar7[1] = (pfVar7[1] - fVar13 * fVar21) * auVar25._4_4_ + fVar21;
            pfVar7[2] = (fVar1 - fVar14 * fVar22) * auVar25._8_4_ + fVar22;
            pfVar7[3] = (fVar12 - fVar15 * fVar23) * auVar25._12_4_ + fVar23;
            pfVar7 = pfVar7 + 4;
            uVar8 = uVar8 - 1;
          } while (uVar8 != 0);
        }
        uVar6 = uVar6 + 1;
      } while (uVar6 != uVar2);
    }
  }
  else if (0 < (int)uVar2) {
    uVar6 = 0;
    do {
      pfVar7 = (float *)(bottom_top_blob->cstep * uVar6 * bottom_top_blob->elemsize +
                        (long)bottom_top_blob->data);
      if ((int)uVar9 < 4) {
        uVar8 = 0;
      }
      else {
        iVar5 = 3;
        do {
          fVar1 = pfVar7[2];
          fVar12 = pfVar7[3];
          auVar17._0_8_ = *(ulong *)pfVar7 ^ 0x8000000080000000;
          auVar17._8_4_ = -fVar1;
          auVar17._12_4_ = -fVar12;
          auVar4._8_4_ = 0x42b0c0a5;
          auVar4._0_8_ = 0x42b0c0a542b0c0a5;
          auVar4._12_4_ = 0x42b0c0a5;
          auVar18 = minps(auVar17,auVar4);
          auVar25._8_4_ = 0xc2b0c0a5;
          auVar25._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar25._12_4_ = 0xc2b0c0a5;
          auVar18 = maxps(auVar18,auVar25);
          fVar11 = auVar18._0_4_ * 1.442695 + 0.5;
          fVar13 = auVar18._4_4_ * 1.442695 + 0.5;
          fVar14 = auVar18._8_4_ * 1.442695 + 0.5;
          fVar15 = auVar18._12_4_ * 1.442695 + 0.5;
          fVar19 = (float)(int)fVar11;
          fVar21 = (float)(int)fVar13;
          fVar22 = (float)(int)fVar14;
          fVar23 = (float)(int)fVar15;
          fVar19 = fVar19 - (float)(-(uint)(fVar11 < fVar19) & 0x3f800000);
          fVar21 = fVar21 - (float)(-(uint)(fVar13 < fVar21) & 0x3f800000);
          fVar22 = fVar22 - (float)(-(uint)(fVar14 < fVar22) & 0x3f800000);
          fVar23 = fVar23 - (float)(-(uint)(fVar15 < fVar23) & 0x3f800000);
          fVar11 = fVar19 * -0.6931472 + auVar18._0_4_;
          fVar13 = fVar21 * -0.6931472 + auVar18._4_4_;
          fVar14 = fVar22 * -0.6931472 + auVar18._8_4_;
          fVar15 = fVar23 * -0.6931472 + auVar18._12_4_;
          auVar16._0_4_ =
               fVar11 + 1.0 +
               (((((fVar11 * 0.00019875691 + 0.0013981999) * fVar11 + 0.008333452) * fVar11 +
                 0.041665796) * fVar11 + 0.16666666) * fVar11 + 0.5) * fVar11 * fVar11;
          auVar16._4_4_ =
               fVar13 + 1.0 +
               (((((fVar13 * 0.00019875691 + 0.0013981999) * fVar13 + 0.008333452) * fVar13 +
                 0.041665796) * fVar13 + 0.16666666) * fVar13 + 0.5) * fVar13 * fVar13;
          auVar16._8_4_ =
               fVar14 + 1.0 +
               (((((fVar14 * 0.00019875691 + 0.0013981999) * fVar14 + 0.008333452) * fVar14 +
                 0.041665796) * fVar14 + 0.16666666) * fVar14 + 0.5) * fVar14 * fVar14;
          auVar16._12_4_ =
               fVar15 + 1.0 +
               (((((fVar15 * 0.00019875691 + 0.0013981999) * fVar15 + 0.008333452) * fVar15 +
                 0.041665796) * fVar15 + 0.16666666) * fVar15 + 0.5) * fVar15 * fVar15;
          fVar11 = (float)((int)fVar19 * 0x800000 + 0x3f800000) * auVar16._0_4_ + 1.0;
          fVar13 = (float)((int)fVar21 * 0x800000 + 0x3f800000) * auVar16._4_4_ + 1.0;
          fVar14 = (float)((int)fVar22 * 0x800000 + 0x3f800000) * auVar16._8_4_ + 1.0;
          fVar15 = (float)((int)fVar23 * 0x800000 + 0x3f800000) * auVar16._12_4_ + 1.0;
          auVar18._4_4_ = fVar13;
          auVar18._0_4_ = fVar11;
          auVar18._8_4_ = fVar14;
          auVar18._12_4_ = fVar15;
          auVar18 = rcpps(auVar16,auVar18);
          fVar19 = *pfVar7 * auVar18._0_4_;
          fVar21 = pfVar7[1] * auVar18._4_4_;
          fVar22 = fVar1 * auVar18._8_4_;
          fVar23 = fVar12 * auVar18._12_4_;
          *pfVar7 = (*pfVar7 - fVar11 * fVar19) * auVar18._0_4_ + fVar19;
          pfVar7[1] = (pfVar7[1] - fVar13 * fVar21) * auVar18._4_4_ + fVar21;
          pfVar7[2] = (fVar1 - fVar14 * fVar22) * auVar18._8_4_ + fVar22;
          pfVar7[3] = (fVar12 - fVar15 * fVar23) * auVar18._12_4_ + fVar23;
          pfVar7 = pfVar7 + 4;
          iVar5 = iVar5 + 4;
          uVar8 = uVar9 & 0xfffffffc;
        } while (iVar5 < (int)uVar9);
      }
      if (uVar9 - uVar8 != 0 && (int)uVar8 <= (int)uVar9) {
        lVar10 = 0;
        do {
          fVar1 = pfVar7[lVar10];
          fVar12 = expf(-fVar1);
          pfVar7[lVar10] = fVar1 / (fVar12 + 1.0);
          lVar10 = lVar10 + 1;
        } while (uVar9 - uVar8 != (int)lVar10);
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 != uVar2);
  }
  return 0;
}

Assistant:

int Swish_x86::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int size = w * h;
#if __SSE2__
    int elempack = bottom_top_blob.elempack;

#if __AVX__
    if (elempack == 8)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                _mm256_storeu_ps(ptr, swish_avx(_p));
                ptr += 8;
            }
        }

        return 0;
    }
#endif // __AVX__

    if (elempack == 4)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                __m128 _p = _mm_loadu_ps(ptr);
                _mm_storeu_ps(ptr, swish_sse(_p));
                ptr += 4;
            }
        }

        return 0;
    }
#endif // __SSE2__

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _mm256_storeu_ps(ptr, swish_avx(_p));
            ptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_loadu_ps(ptr);
            _mm_storeu_ps(ptr, swish_sse(_p));
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = *ptr / (1.f + exp(-*ptr));
            ptr++;
        }
    }

    return 0;
}